

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  uint uVar1;
  int iVar2;
  double dVar3;
  long *plVar4;
  EVP_PKEY_CTX *src;
  long lVar5;
  Fad<double> *this_00;
  ulong uVar6;
  Fad<double> *pFVar7;
  long lVar8;
  
  if (this != a) {
    uVar1 = this->num_elts;
    if (uVar1 == 0) {
      iVar2 = a->num_elts;
      lVar8 = (long)iVar2;
      if (lVar8 == 0) {
        return this;
      }
      this->num_elts = iVar2;
      uVar6 = 0xffffffffffffffff;
      if (-1 < iVar2) {
        uVar6 = lVar8 * 0x20 + 8;
      }
      plVar4 = (long *)operator_new__(uVar6);
      *plVar4 = lVar8;
      lVar5 = 0;
      pFVar7 = (Fad<double> *)(plVar4 + 1);
      do {
        Fad<double>::Fad(pFVar7);
        lVar5 = lVar5 + -0x20;
        pFVar7 = pFVar7 + 1;
      } while (-lVar5 != lVar8 * 0x20);
      this->ptr_to_data = (Fad<double> *)(plVar4 + 1);
      uVar1 = this->num_elts;
    }
    src = (EVP_PKEY_CTX *)(ulong)uVar1;
    pFVar7 = this->ptr_to_data;
    if (uVar1 != a->num_elts) {
      if (pFVar7 != (Fad<double> *)0x0) {
        dVar3 = pFVar7[-1].defaultVal;
        if (dVar3 != 0.0) {
          lVar8 = (long)dVar3 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar7[-1].val_ + lVar8));
            lVar8 = lVar8 + -0x20;
          } while (lVar8 != 0);
        }
        operator_delete__(&pFVar7[-1].defaultVal,(long)dVar3 << 5 | 8);
      }
      this->num_elts = 0;
      this->ptr_to_data = (Fad<double> *)0x0;
      iVar2 = a->num_elts;
      lVar8 = (long)iVar2;
      if (lVar8 == 0) {
        src = (EVP_PKEY_CTX *)0x0;
        pFVar7 = (Fad<double> *)0x0;
      }
      else {
        this->num_elts = iVar2;
        uVar6 = 0xffffffffffffffff;
        if (-1 < iVar2) {
          uVar6 = lVar8 * 0x20 + 8;
        }
        plVar4 = (long *)operator_new__(uVar6);
        *plVar4 = lVar8;
        pFVar7 = (Fad<double> *)(plVar4 + 1);
        lVar5 = 0;
        this_00 = pFVar7;
        do {
          Fad<double>::Fad(this_00);
          lVar5 = lVar5 + -0x20;
          this_00 = this_00 + 1;
        } while (-lVar5 != lVar8 * 0x20);
        this->ptr_to_data = pFVar7;
        src = (EVP_PKEY_CTX *)(ulong)(uint)this->num_elts;
      }
    }
    MEM_CPY<Fad<double>_>::copy((MEM_CPY<Fad<double>_> *)pFVar7,(EVP_PKEY_CTX *)a->ptr_to_data,src);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const Vector< T >& a)
{
  if ( this != &a) {
    // Cas ou le pointeur est non alloue
    if ( num_elts == 0 ) {
      if ( a.num_elts == 0 ) return (*this);
      else reserve(a.num_elts);
    }
    // Cas ou le pointeur est deja alloue
    if ( num_elts != a.num_elts ) {
      //cerr << "size = " << num_elts << ", a.size = " << a.num_elts << endl;
      //cerr << "ptr_to_data = " << (void*)ptr_to_data << ", a.ptr_to_data = " << (void*)a.ptr_to_data << endl;
      //error("Vector::operator=, tailles incompatibles");
      destroy();//on desalloue
      reserve(a.num_elts);
    }
    
    copy(a);
  }

  return *this;
}